

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

gpointer g_hash_table_lookup(GHashTable *hash_table,gconstpointer key)

{
  guint gVar1;
  gpointer pvVar2;
  
  if (hash_table != (GHashTable *)0x0) {
    gVar1 = g_hash_table_lookup_node(hash_table,key);
    if (hash_table->nodes[gVar1].key_hash == 0) {
      pvVar2 = (gpointer)0x0;
    }
    else {
      pvVar2 = hash_table->nodes[gVar1].value;
    }
    return pvVar2;
  }
  return (gpointer)0x0;
}

Assistant:

gpointer g_hash_table_lookup (GHashTable   *hash_table,
        gconstpointer key)
{
    GHashNode *node;
    guint      node_index;

    if (hash_table == NULL) return NULL;

    node_index = g_hash_table_lookup_node (hash_table, key);
    node = &hash_table->nodes [node_index];

    return node->key_hash ? node->value : NULL;
}